

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O2

void __thiscall
nestl::has_exceptions::vector<int,_nestl::allocator<int>_>::vector
          (vector<int,_nestl::allocator<int>_> *this,vector<int,_nestl::allocator<int>_> *other)

{
  bool bVar1;
  default_operation_error err;
  exception_ptr local_20;
  exception_ptr local_18;
  
  (this->super_vector<int,_nestl::allocator<int>_>).m_start = (pointer)0x0;
  (this->super_vector<int,_nestl::allocator<int>_>).m_finish = (pointer)0x0;
  (this->super_vector<int,_nestl::allocator<int>_>).m_end_of_storage = (pointer)0x0;
  local_20._M_exception_object = (void *)0x0;
  impl::vector<int,_nestl::allocator<int>_>::
  copy_nothrow<nestl::has_exceptions::exception_ptr_error>
            (&this->super_vector<int,_nestl::allocator<int>_>,(exception_ptr_error *)&local_20,
             &other->super_vector<int,_nestl::allocator<int>_>);
  bVar1 = exception_ptr_error::operator_cast_to_bool((exception_ptr_error *)&local_20);
  if (bVar1) {
    std::__exception_ptr::exception_ptr::exception_ptr(&local_18,&local_20);
    throw_exception((exception_ptr_error *)&local_18);
    std::__exception_ptr::exception_ptr::~exception_ptr(&local_18);
  }
  std::__exception_ptr::exception_ptr::~exception_ptr(&local_20);
  return;
}

Assistant:

vector<T, A>::vector(const vector& other)
    : base_t(other.get_allocator())
{
    default_operation_error err;
    this->copy_nothrow(err, other);
    if (err)
    {
        throw_exception(err);
    }
}